

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::diag_kronecker_prod_fs_test
               (features *f1,features *f2,features *prod_f,float *total_sum_feat_sq,float norm_sq1,
               float norm_sq2)

{
  float *pfVar1;
  ulong i;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  
  features::delete_v(prod_f);
  if ((f2->indicies)._end != (f2->indicies)._begin) {
    fVar6 = powf(norm_sq1 * norm_sq2,0.5);
    pfVar3 = (f1->values)._begin;
    if ((f1->values)._end != pfVar3) {
      uVar5 = 0;
      uVar4 = 0;
      do {
        pfVar1 = (f2->values)._begin;
        if ((ulong)((long)(f2->values)._end - (long)pfVar1 >> 2) <= uVar4) {
          return;
        }
        i = (f1->indicies)._begin[uVar5];
        uVar2 = (f2->indicies)._begin[uVar4];
        if (i < uVar2) {
          uVar5 = uVar5 + 1;
        }
        else {
          if (i <= uVar2) {
            features::push_back(prod_f,(pfVar3[uVar5] * pfVar1[uVar4]) / fVar6,i);
            *total_sum_feat_sq =
                 ((f1->values)._begin[uVar5] * (f2->values)._begin[uVar4]) / fVar6 +
                 *total_sum_feat_sq;
            uVar5 = uVar5 + 1;
          }
          uVar4 = uVar4 + 1;
        }
        pfVar3 = (f1->values)._begin;
      } while (uVar5 < (ulong)((long)(f1->values)._end - (long)pfVar3 >> 2));
    }
  }
  return;
}

Assistant:

void diag_kronecker_prod_fs_test(features& f1, features& f2, features& prod_f, float& total_sum_feat_sq, float norm_sq1, float norm_sq2)
    {
        prod_f.delete_v();
        if (f2.indicies.size() == 0)
            return;
    
        float denominator = pow(norm_sq1*norm_sq2,0.5f);
        size_t idx1 = 0;
        size_t idx2 = 0;

        while (idx1 < f1.size() && idx2 < f2.size())
        {
            uint64_t ec1pos = f1.indicies[idx1];
            uint64_t ec2pos = f2.indicies[idx2];
            
            if (ec1pos < ec2pos)
                idx1++;
            else if(ec1pos > ec2pos)
                idx2++;
            else{
                prod_f.push_back(f1.values[idx1]*f2.values[idx2]/denominator, ec1pos);
                total_sum_feat_sq+=f1.values[idx1]*f2.values[idx2]/denominator;  //make this out of loop
                idx1++;
                idx2++;
            }
        }
    }